

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O1

void vera::dynamicCubemap
               (function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>
                *_renderFnc,string *_file,vec3 _pos,int _viewSize)

{
  undefined4 _width;
  undefined4 _height;
  undefined1 auVar1 [16];
  int iVar2;
  ostream *this;
  long *plVar3;
  uchar *_pixels;
  socklen_t in_ECX;
  int _viewSize_00;
  undefined4 in_register_00000014;
  sockaddr *__addr;
  sockaddr *extraout_RDX;
  string *psVar4;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  vec3 _pos_00;
  _Any_data local_68;
  code *local_58;
  undefined1 local_48 [16];
  
  __addr = (sockaddr *)CONCAT44(in_register_00000014,_viewSize);
  _pos_00.field_2 = _pos.field_2;
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = _pos._0_8_;
  local_48._12_4_ = in_XMM0_Dd;
  if (((cubemapFbo[0x30] != '\x01') || (cubemapFbo._40_4_ != _viewSize)) ||
     (psVar4 = _file, cubemapFbo._44_4_ != _viewSize)) {
    psVar4 = (string *)(ulong)(uint)(_viewSize * 4);
    in_ECX = 1;
    Fbo::allocate((Fbo *)cubemapFbo,_viewSize * 4,_viewSize * 3,COLOR_TEXTURE_DEPTH_BUFFER,LINEAR,
                  REPEAT,true);
    __addr = extraout_RDX;
  }
  Fbo::bind((Fbo *)cubemapFbo,(int)psVar4,__addr,in_ECX);
  std::function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)>::function
            ((function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> *)
             &local_68,_renderFnc);
  auVar1 = local_48;
  _pos_00.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)local_48._0_4_;
  _pos_00.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_48._4_4_;
  local_48 = auVar1;
  dynamicCubemap((vera *)local_68._M_pod_data,
                 (function<void_(vera::Camera_&,_glm::vec<4,_float,_(glm::qualifier)0>_&,_int_&)> *)
                 (ulong)(uint)_viewSize,_pos_00,_viewSize_00);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  Fbo::unbind((Fbo *)cubemapFbo);
  glBindFramebuffer(0x8d40,cubemapFbo._20_4_);
  _height = cubemapFbo._44_4_;
  _width = cubemapFbo._40_4_;
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,cubemapFbo._40_4_);
  std::__ostream_insert<char,std::char_traits<char>>(this,"x",1);
  plVar3 = (long *)std::ostream::operator<<((ostream *)this,_height);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = -1;
  if (-1 < (int)(_height * _width)) {
    iVar2 = _height * _width * 4;
  }
  _pixels = (uchar *)operator_new__((long)iVar2);
  glReadPixels(0,0,_width,_height,0x1908,0x1401,_pixels);
  savePixels(_file,_pixels,_width,_height);
  operator_delete__(_pixels);
  glBindFramebuffer(0x8d40,0);
  return;
}

Assistant:

void dynamicCubemap(std::function<void(Camera&, glm::vec4&, int&)> _renderFnc, const std::string& _file, glm::vec3 _pos, int _viewSize) {
    if (!cubemapFbo.isAllocated() || cubemapFbo.getWidth() != _viewSize || cubemapFbo.getHeight() != _viewSize)
        cubemapFbo.allocate(_viewSize * 4, _viewSize * 3, COLOR_TEXTURE_DEPTH_BUFFER);

    cubemapFbo.bind();

    dynamicCubemap(_renderFnc, _pos, _viewSize);

    cubemapFbo.unbind();

    glBindFramebuffer(GL_FRAMEBUFFER, cubemapFbo.getId());
    int width = cubemapFbo.getWidth();
    int height = cubemapFbo.getHeight();
    std::cout << width << "x" << height << std::endl;

    unsigned char* pixels = new unsigned char[width * height*4];
    glReadPixels(0, 0, width, height, GL_RGBA, GL_UNSIGNED_BYTE, pixels);
    savePixels(_file, pixels, width, height);
    delete[] pixels;
    glBindFramebuffer(GL_FRAMEBUFFER, 0);
}